

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O2

SQChar * replace_substring_internal
                   (SQAllocContext allocctx,SQChar *s,SQInteger *buf_len,SQInteger *len,int pos,
                   SQInteger len_from,SQChar *to,SQInteger len_to)

{
  long lVar1;
  long lVar2;
  
  lVar2 = len_to - len_from;
  if (lVar2 != 0 && len_from <= len_to) {
    s = (SQChar *)sq_realloc(allocctx,s,*buf_len,*buf_len + lVar2);
    *buf_len = *buf_len + lVar2;
  }
  lVar1 = (long)pos;
  if (len_to != len_from) {
    memmove(s + len_to + lVar1,s + len_from + lVar1,*len - (len_from + lVar1));
  }
  memcpy(s + lVar1,to,len_to);
  *len = *len + lVar2;
  return s;
}

Assistant:

static SQChar* replace_substring_internal(SQAllocContext allocctx, SQChar *s, SQInteger &buf_len, SQInteger &len,
    int pos, SQInteger len_from, const SQChar *to, SQInteger len_to)
{
    SQInteger d_size = len_to - len_from;
    if (d_size > 0) {
        s = (SQChar*)sq_realloc(allocctx, s, buf_len * sizeof(SQChar), (buf_len + d_size) * sizeof(SQChar));
        buf_len += d_size;
    }
    if (d_size != 0)
        memmove(s + pos + len_to, s + pos + len_from, (len - pos - len_from) * sizeof(SQChar));
    memcpy(s + pos, to, len_to * sizeof(SQChar));
    len += d_size;

    return s;
}